

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_taylor.cpp
# Opt level: O0

int taylor_compare<double,4,5>(taylor<double,_4,_5> *t1,taylor<double,_4,_5> *t2,num_t thres)

{
  double dVar1;
  ostream *poVar2;
  double *pdVar3;
  taylor<double,_4,_5> *ptVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [32];
  ostringstream local_330 [8];
  ostringstream errmsg;
  ostringstream local_1a8 [8];
  ostringstream message;
  double err;
  int i;
  int nfail;
  num_t thres_local;
  taylor<double,_4,_5> *t2_local;
  taylor<double,_4,_5> *t1_local;
  
  err._4_4_ = 0;
  for (err._0_4_ = 0; err._0_4_ < 0x7e; err._0_4_ = err._0_4_ + 1) {
    taylor<double,_4,_5>::operator[](t1,err._0_4_);
    ptVar4 = t2;
    taylor<double,_4,_5>::operator[](t2,err._0_4_);
    std::abs((int)ptVar4);
    taylor<double,_4,_5>::operator[](t1,err._0_4_);
    ptVar4 = t2;
    taylor<double,_4,_5>::operator[](t2,err._0_4_);
    std::abs((int)ptVar4);
    if (thres < (extraout_XMM0_Qa * 2.0) / (extraout_XMM0_Qa_00 * 0.5 + 1.0)) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = std::operator<<((ostream *)local_1a8,"Difference in coefficient ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,err._0_4_);
      poVar2 = std::operator<<(poVar2,". Correct:");
      pdVar3 = taylor<double,_4,_5>::operator[](t1,err._0_4_);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
      poVar2 = std::operator<<(poVar2,", taylor:");
      pdVar3 = taylor<double,_4,_5>::operator[](t2,err._0_4_);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
      poVar2 = std::operator<<(poVar2," difference: ");
      pdVar3 = taylor<double,_4,_5>::operator[](t1,err._0_4_);
      dVar1 = *pdVar3;
      pdVar3 = taylor<double,_4,_5>::operator[](t2,err._0_4_);
      std::ostream::operator<<(poVar2,dVar1 - *pdVar3);
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_350,"Taylor fatal error.\n",&local_351);
      poVar2 = std::operator<<((ostream *)local_330,local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378," In function ",&local_379);
      poVar2 = std::operator<<(poVar2,local_378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,"taylor_compare",&local_3a1);
      poVar2 = std::operator<<(poVar2,local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c8," at line ",&local_3c9);
      poVar2 = std::operator<<(poVar2,local_3c8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0," of file ",&local_3f1);
      poVar2 = std::operator<<(poVar2,local_3f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_418,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/tests/unittest_taylor.cpp"
                 ,&local_419);
      poVar2 = std::operator<<(poVar2,local_418);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      std::__cxx11::ostringstream::str();
      message_and_die(local_440,(ostringstream *)local_1a8);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::ostringstream::~ostringstream(local_330);
      err._4_4_ = err._4_4_ + 1;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  return err._4_4_;
}

Assistant:

int taylor_compare(const taylor<T, Nvar, Ndeg> & t1,
                   const taylor<T, Nvar, Ndeg> & t2,
                   num_t thres) {
  int nfail = 0;
  for (int i = 0; i < t1.size; i++) {
    T err = 2 * std::abs(t1[i] - t2[i]) / (1 + 0.5 * std::abs(t1[i] + t2[i]));
    if (err > thres) {
      std::ostringstream message;
      message << "Difference in coefficient " << i << ". Correct:" << t1[i]
              << ", taylor:" << t2[i] << " difference: " << t1[i] - t2[i];
      TAYLOR_ERROR(message);
      nfail++;
    }
  }
  return nfail;
}